

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFFormValue.cpp
# Opt level: O1

bool __thiscall
llvm::DWARFFormValue::extractValue
          (DWARFFormValue *this,DWARFDataExtractor *Data,uint64_t *OffsetPtr,FormParams FP,
          DWARFContext *Ctx,DWARFUnit *CU)

{
  Form FVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  bool bVar5;
  byte bVar6;
  bool bVar7;
  uint16_t uVar8;
  uint uVar9;
  ulong uVar10;
  uint64_t uVar11;
  anon_union_8_3_82d75f4a_for_ValueType_0 aVar12;
  uint64_t *SecNdx;
  uint32_t uVar13;
  ulong uVar14;
  char *pcVar15;
  DwarfFormat local_34;
  
  if (CU != (DWARFUnit *)0x0 && Ctx == (DWARFContext *)0x0) {
    Ctx = CU->Context;
  }
  this->C = Ctx;
  this->U = CU;
  (this->Value).data = (uint8_t *)0x0;
  bVar7 = false;
LAB_00d8b202:
  FVar1 = this->Form;
  local_34 = FP.Format;
  switch(FVar1) {
  case DW_FORM_addr:
  case DW_FORM_ref_addr:
    uVar9 = (uint)FP >> 0x10;
    if ((FVar1 != DW_FORM_addr && ((uint)FP & 0xffff) != 2) && (uVar9 = 4, local_34 != DWARF32)) {
      if ((uint)FP >> 0x18 != 1) goto LAB_00d8b438;
      uVar9 = 8;
    }
    uVar13 = uVar9 & 0xff;
    SecNdx = &(this->Value).SectionIndex;
    goto LAB_00d8b2b2;
  case 2:
  case DW_FORM_implicit_const:
  case DW_FORM_loclistx:
  case DW_FORM_addrx3:
switchD_00d8b218_caseD_2:
    llvm_unreachable_internal
              ("unsupported form",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFFormValue.cpp"
               ,0x15d);
  case DW_FORM_block2:
    uVar8 = DataExtractor::getU16(&Data->super_DataExtractor,OffsetPtr,(Error *)0x0);
    uVar11 = (uint64_t)uVar8;
    goto LAB_00d8b35b;
  case DW_FORM_block4:
    uVar13 = DataExtractor::getU32(&Data->super_DataExtractor,OffsetPtr,(Error *)0x0);
    uVar11 = (uint64_t)uVar13;
    goto LAB_00d8b35b;
  case DW_FORM_data2:
  case DW_FORM_ref2:
  case DW_FORM_strx2:
  case DW_FORM_addrx2:
    uVar8 = DataExtractor::getU16(&Data->super_DataExtractor,OffsetPtr,(Error *)0x0);
    uVar10 = (ulong)uVar8;
    break;
  case DW_FORM_data4:
  case DW_FORM_ref4:
  case DW_FORM_ref_sup4:
  case DW_FORM_strx4:
  case DW_FORM_addrx4:
    uVar13 = 4;
    goto LAB_00d8b2ad;
  case DW_FORM_data8:
  case DW_FORM_ref8:
  case DW_FORM_ref_sup8:
    uVar13 = 8;
    goto LAB_00d8b2ad;
  case DW_FORM_string:
    aVar12.cstr = DataExtractor::getCStr(&Data->super_DataExtractor,OffsetPtr);
    goto LAB_00d8b3bf;
  case DW_FORM_block:
  case DW_FORM_exprloc:
    uVar11 = DataExtractor::getULEB128(&Data->super_DataExtractor,OffsetPtr,(Error *)0x0);
    goto LAB_00d8b35b;
  case DW_FORM_block1:
    bVar6 = DataExtractor::getU8(&Data->super_DataExtractor,OffsetPtr,(Error *)0x0);
    uVar11 = (uint64_t)bVar6;
LAB_00d8b35b:
    bVar5 = false;
    (this->Value).field_0.uval = uVar11;
    bVar7 = true;
    goto LAB_00d8b2be;
  case DW_FORM_data1:
  case DW_FORM_flag:
  case DW_FORM_ref1:
  case DW_FORM_strx1:
  case DW_FORM_addrx1:
    bVar6 = DataExtractor::getU8(&Data->super_DataExtractor,OffsetPtr,(Error *)0x0);
    uVar10 = (ulong)bVar6;
    break;
  case DW_FORM_sdata:
    aVar12.sval = DataExtractor::getSLEB128(&Data->super_DataExtractor,OffsetPtr);
    goto LAB_00d8b3bf;
  case DW_FORM_strp:
  case DW_FORM_sec_offset:
  case DW_FORM_strp_sup:
  case DW_FORM_line_strp:
    goto switchD_00d8b218_caseD_e;
  case DW_FORM_udata:
  case DW_FORM_ref_udata:
  case DW_FORM_strx:
  case DW_FORM_addrx:
  case DW_FORM_rnglistx:
switchD_00d8b218_caseD_f:
    uVar10 = DataExtractor::getULEB128(&Data->super_DataExtractor,OffsetPtr,(Error *)0x0);
    break;
  case DW_FORM_indirect:
    uVar11 = DataExtractor::getULEB128(&Data->super_DataExtractor,OffsetPtr,(Error *)0x0);
    this->Form = (Form)uVar11;
    bVar5 = true;
    goto LAB_00d8b2be;
  case DW_FORM_flag_present:
    (this->Value).field_0.uval = 1;
    goto LAB_00d8b3dd;
  case DW_FORM_data16:
    (this->Value).field_0.uval = 0x10;
    bVar7 = true;
    goto LAB_00d8b3dd;
  case DW_FORM_ref_sig8:
    uVar10 = DataExtractor::getU64(&Data->super_DataExtractor,OffsetPtr,(Error *)0x0);
    break;
  case DW_FORM_strx3:
    aVar12._0_4_ = DataExtractor::getU24(&Data->super_DataExtractor,OffsetPtr);
    aVar12.uval._4_4_ = 0;
LAB_00d8b3bf:
    (this->Value).field_0 = aVar12;
LAB_00d8b3dd:
    bVar5 = false;
    goto LAB_00d8b2be;
  default:
    if (FVar1 - 0x1f01 < 2) goto switchD_00d8b218_caseD_f;
    if (1 < FVar1 - 0x1f20) goto switchD_00d8b218_caseD_2;
    goto switchD_00d8b218_caseD_e;
  }
LAB_00d8b2ba:
  bVar5 = false;
  (this->Value).field_0.uval = uVar10;
LAB_00d8b2be:
  if (!bVar5) {
    if (bVar7) {
      pcVar2 = (Data->super_DataExtractor).Data.Data;
      uVar10 = (Data->super_DataExtractor).Data.Length;
      uVar3 = *OffsetPtr;
      pcVar4 = (this->Value).field_0.cstr;
      uVar14 = uVar3;
      if (uVar10 < uVar3) {
        uVar14 = uVar10;
      }
      pcVar15 = (char *)(uVar10 - uVar14);
      if (pcVar4 <= (char *)(uVar10 - uVar14)) {
        pcVar15 = pcVar4;
      }
      (this->Value).data = (uint8_t *)0x0;
      if (pcVar15 != (char *)0x0) {
        (this->Value).data = (uint8_t *)(pcVar2 + uVar14);
        *OffsetPtr = (uint64_t)(pcVar4 + uVar3);
      }
    }
    return true;
  }
  goto LAB_00d8b202;
switchD_00d8b218_caseD_e:
  uVar13 = 4;
  if (local_34 != DWARF32) {
    if ((uint)FP >> 0x18 != 1) {
LAB_00d8b438:
      llvm_unreachable_internal
                ("Invalid Format value",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/BinaryFormat/Dwarf.h"
                 ,0x230);
    }
    uVar13 = 8;
  }
LAB_00d8b2ad:
  SecNdx = (uint64_t *)0x0;
LAB_00d8b2b2:
  uVar10 = DWARFDataExtractor::getRelocatedValue(Data,uVar13,OffsetPtr,SecNdx,(Error *)0x0);
  goto LAB_00d8b2ba;
}

Assistant:

bool DWARFFormValue::extractValue(const DWARFDataExtractor &Data,
                                  uint64_t *OffsetPtr, dwarf::FormParams FP,
                                  const DWARFContext *Ctx,
                                  const DWARFUnit *CU) {
  if (!Ctx && CU)
    Ctx = &CU->getContext();
  C = Ctx;
  U = CU;
  bool Indirect = false;
  bool IsBlock = false;
  Value.data = nullptr;
  // Read the value for the form into value and follow and DW_FORM_indirect
  // instances we run into
  do {
    Indirect = false;
    switch (Form) {
    case DW_FORM_addr:
    case DW_FORM_ref_addr: {
      uint16_t Size =
          (Form == DW_FORM_addr) ? FP.AddrSize : FP.getRefAddrByteSize();
      Value.uval = Data.getRelocatedValue(Size, OffsetPtr, &Value.SectionIndex);
      break;
    }
    case DW_FORM_exprloc:
    case DW_FORM_block:
      Value.uval = Data.getULEB128(OffsetPtr);
      IsBlock = true;
      break;
    case DW_FORM_block1:
      Value.uval = Data.getU8(OffsetPtr);
      IsBlock = true;
      break;
    case DW_FORM_block2:
      Value.uval = Data.getU16(OffsetPtr);
      IsBlock = true;
      break;
    case DW_FORM_block4:
      Value.uval = Data.getU32(OffsetPtr);
      IsBlock = true;
      break;
    case DW_FORM_data1:
    case DW_FORM_ref1:
    case DW_FORM_flag:
    case DW_FORM_strx1:
    case DW_FORM_addrx1:
      Value.uval = Data.getU8(OffsetPtr);
      break;
    case DW_FORM_data2:
    case DW_FORM_ref2:
    case DW_FORM_strx2:
    case DW_FORM_addrx2:
      Value.uval = Data.getU16(OffsetPtr);
      break;
    case DW_FORM_strx3:
      Value.uval = Data.getU24(OffsetPtr);
      break;
    case DW_FORM_data4:
    case DW_FORM_ref4:
    case DW_FORM_ref_sup4:
    case DW_FORM_strx4:
    case DW_FORM_addrx4:
      Value.uval = Data.getRelocatedValue(4, OffsetPtr);
      break;
    case DW_FORM_data8:
    case DW_FORM_ref8:
    case DW_FORM_ref_sup8:
      Value.uval = Data.getRelocatedValue(8, OffsetPtr);
      break;
    case DW_FORM_data16:
      // Treat this like a 16-byte block.
      Value.uval = 16;
      IsBlock = true;
      break;
    case DW_FORM_sdata:
      Value.sval = Data.getSLEB128(OffsetPtr);
      break;
    case DW_FORM_udata:
    case DW_FORM_ref_udata:
    case DW_FORM_rnglistx:
      Value.uval = Data.getULEB128(OffsetPtr);
      break;
    case DW_FORM_string:
      Value.cstr = Data.getCStr(OffsetPtr);
      break;
    case DW_FORM_indirect:
      Form = static_cast<dwarf::Form>(Data.getULEB128(OffsetPtr));
      Indirect = true;
      break;
    case DW_FORM_strp:
    case DW_FORM_sec_offset:
    case DW_FORM_GNU_ref_alt:
    case DW_FORM_GNU_strp_alt:
    case DW_FORM_line_strp:
    case DW_FORM_strp_sup: {
      Value.uval =
          Data.getRelocatedValue(FP.getDwarfOffsetByteSize(), OffsetPtr);
      break;
    }
    case DW_FORM_flag_present:
      Value.uval = 1;
      break;
    case DW_FORM_ref_sig8:
      Value.uval = Data.getU64(OffsetPtr);
      break;
    case DW_FORM_GNU_addr_index:
    case DW_FORM_GNU_str_index:
    case DW_FORM_addrx:
    case DW_FORM_strx:
      Value.uval = Data.getULEB128(OffsetPtr);
      break;
    default:
      // DWARFFormValue::skipValue() will have caught this and caused all
      // DWARF DIEs to fail to be parsed, so this code is not be reachable.
      llvm_unreachable("unsupported form");
    }
  } while (Indirect);

  if (IsBlock) {
    StringRef Str = Data.getData().substr(*OffsetPtr, Value.uval);
    Value.data = nullptr;
    if (!Str.empty()) {
      Value.data = Str.bytes_begin();
      *OffsetPtr += Value.uval;
    }
  }

  return true;
}